

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CurrentThread.cc
# Opt level: O0

string * muduo::CurrentThread::stackTrace_abi_cxx11_(bool demangle)

{
  int iVar1;
  char *__first;
  byte in_SIL;
  string *in_RDI;
  char *ret;
  int status;
  char *p;
  char *plus;
  char *left_par;
  int i;
  char *demangled;
  size_t len;
  char **strings;
  int nptrs;
  void *frame [200];
  int max_frames;
  string *stack;
  char *local_6d8;
  undefined4 in_stack_fffffffffffff940;
  uint in_stack_fffffffffffff950;
  int iVar2;
  char *local_6a8;
  char *local_6a0;
  char *local_698;
  int local_68c;
  char *local_688;
  undefined8 local_680;
  void *local_678;
  int local_65c;
  undefined1 local_658 [1608];
  undefined4 local_10;
  undefined1 local_a;
  byte local_9;
  
  local_9 = in_SIL & 1;
  local_a = 0;
  std::__cxx11::string::string(in_RDI);
  local_10 = 200;
  iVar1 = backtrace(local_658,200);
  local_65c = iVar1;
  local_678 = (void *)backtrace_symbols(local_658,iVar1);
  if (local_678 != (void *)0x0) {
    local_680 = 0x100;
    if ((local_9 & 1) == 0) {
      local_6d8 = (char *)0x0;
    }
    else {
      local_6d8 = (char *)malloc(0x100);
    }
    local_688 = local_6d8;
    for (local_68c = 1; local_68c < local_65c; local_68c = local_68c + 1) {
      if ((local_9 & 1) == 0) {
LAB_00148152:
        std::__cxx11::string::append((char *)in_RDI);
        std::__cxx11::string::push_back((char)in_RDI);
      }
      else {
        local_698 = (char *)0x0;
        local_6a0 = (char *)0x0;
        for (local_6a8 = *(char **)((long)local_678 + (long)local_68c * 8); *local_6a8 != '\0';
            local_6a8 = local_6a8 + 1) {
          if (*local_6a8 == '(') {
            local_698 = local_6a8;
          }
          else if (*local_6a8 == '+') {
            local_6a0 = local_6a8;
          }
        }
        if ((local_698 == (char *)0x0) || (local_6a0 == (char *)0x0)) goto LAB_00148152;
        *local_6a0 = '\0';
        iVar2 = 0;
        __first = (char *)__cxa_demangle(local_698 + 1,local_688,&local_680,&stack0xfffffffffffff954
                                        );
        *local_6a0 = '+';
        if (iVar2 != 0) goto LAB_00148152;
        std::__cxx11::string::append<char*,void>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (ulong)in_stack_fffffffffffff950,__first,
                   (char *)CONCAT44(iVar1,in_stack_fffffffffffff940));
        std::__cxx11::string::append((char *)in_RDI);
        std::__cxx11::string::append((char *)in_RDI);
        std::__cxx11::string::push_back((char)in_RDI);
        local_688 = __first;
      }
    }
    free(local_688);
    free(local_678);
  }
  return in_RDI;
}

Assistant:

string stackTrace(bool demangle)
{
  string stack;
  const int max_frames = 200;
  void* frame[max_frames];
  int nptrs = ::backtrace(frame, max_frames);
  char** strings = ::backtrace_symbols(frame, nptrs);
  if (strings)
  {
    size_t len = 256;
    char* demangled = demangle ? static_cast<char*>(::malloc(len)) : nullptr;
    for (int i = 1; i < nptrs; ++i)  // skipping the 0-th, which is this function
    {
      if (demangle)
      {
        // https://panthema.net/2008/0901-stacktrace-demangled/
        // bin/exception_test(_ZN3Bar4testEv+0x79) [0x401909]
        char* left_par = nullptr;
        char* plus = nullptr;
        for (char* p = strings[i]; *p; ++p)
        {
          if (*p == '(')
            left_par = p;
          else if (*p == '+')
            plus = p;
        }

        if (left_par && plus)
        {
          *plus = '\0';
          int status = 0;
          char* ret = abi::__cxa_demangle(left_par+1, demangled, &len, &status);
          *plus = '+';
          if (status == 0)
          {
            demangled = ret;  // ret could be realloc()
            stack.append(strings[i], left_par+1);
            stack.append(demangled);
            stack.append(plus);
            stack.push_back('\n');
            continue;
          }
        }
      }
      // Fallback to mangled names
      stack.append(strings[i]);
      stack.push_back('\n');
    }
    free(demangled);
    free(strings);
  }
  return stack;
}